

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void help(void)

{
  FILE *pFVar1;
  bool bVar2;
  gen_map_t *pgVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string local_c0;
  string local_a0;
  string local_70;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
  local_40;
  iterator iter;
  gen_map_t gen_map;
  
  fprintf(_stderr,"Usage: thrift [options] file\n");
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"  -version    Print the compiler version\n");
  fprintf(_stderr,"  -o dir      Set the output directory for gen-* packages\n");
  fprintf(_stderr,"               (default: current directory)\n");
  fprintf(_stderr,"  -out dir    Set the ouput location for generated files.\n");
  fprintf(_stderr,"               (no gen-* folder will be created)\n");
  fprintf(_stderr,"  -I dir      Add a directory to the list of directories\n");
  fprintf(_stderr,"                searched for include directives\n");
  fprintf(_stderr,"  -nowarn     Suppress all compiler warnings (BAD!)\n");
  fprintf(_stderr,"  -strict     Strict compiler warnings on\n");
  fprintf(_stderr,"  -v[erbose]  Verbose mode\n");
  fprintf(_stderr,"  -r[ecurse]  Also generate included files\n");
  fprintf(_stderr,"  -debug      Parse debug trace to stdout\n");
  fprintf(_stderr,"  --allow-neg-keys  Allow negative field keys (Used to preserve protocol\n");
  fprintf(_stderr,"                compatibility with older .thrift files)\n");
  fprintf(_stderr,"  --allow-64bit-consts  Do not print warnings about using 64-bit constants\n");
  fprintf(_stderr,"  --gen STR   Generate code with a dynamically-registered generator.\n");
  fprintf(_stderr,"                STR has the form language[:key1=val1[,key2[,key3=val3]]].\n");
  fprintf(_stderr,"                Keys and values are options passed to the generator.\n");
  fprintf(_stderr,"                Many options will not require values.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Options related to audit operation\n");
  fprintf(_stderr,"   --audit OldFile   Old Thrift file to be audited with \'file\'\n");
  fprintf(_stderr,"  -Iold dir    Add a directory to the list of directories\n");
  fprintf(_stderr,"                searched for include directives for old thrift file\n");
  fprintf(_stderr,"  -Inew dir    Add a directory to the list of directories\n");
  fprintf(_stderr,"                searched for include directives for new thrift file\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Available generators (and options):\n");
  pgVar3 = t_generator_registry::get_generator_map_abi_cxx11_();
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
         *)&iter,pgVar3);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
  ::_Rb_tree_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
                      *)&iter);
  local_40._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
                *)&iter);
    bVar2 = std::operator!=(&local_40,&local_50);
    pFVar1 = _stderr;
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
             ::operator->(&local_40);
    t_generator_factory::get_short_name_abi_cxx11_(&local_70,ppVar4->second);
    uVar5 = std::__cxx11::string::c_str();
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
             ::operator->(&local_40);
    t_generator_factory::get_long_name_abi_cxx11_(&local_a0,ppVar4->second);
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"  %s (%s):\n",uVar5,uVar6);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    pFVar1 = _stderr;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
             ::operator->(&local_40);
    t_generator_factory::get_documentation_abi_cxx11_(&local_c0,ppVar4->second);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s",uVar5);
    std::__cxx11::string::~string((string *)&local_c0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
    ::operator++(&local_40);
  }
  exit(1);
}

Assistant:

void help() {
    fprintf(stderr, "Usage: thrift [options] file\n");
    fprintf(stderr, "Options:\n");
    fprintf(stderr, "  -version    Print the compiler version\n");
    fprintf(stderr, "  -o dir      Set the output directory for gen-* packages\n");
    fprintf(stderr, "               (default: current directory)\n");
    fprintf(stderr, "  -out dir    Set the ouput location for generated files.\n");
    fprintf(stderr, "               (no gen-* folder will be created)\n");
    fprintf(stderr, "  -I dir      Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives\n");
    fprintf(stderr, "  -nowarn     Suppress all compiler warnings (BAD!)\n");
    fprintf(stderr, "  -strict     Strict compiler warnings on\n");
    fprintf(stderr, "  -v[erbose]  Verbose mode\n");
    fprintf(stderr, "  -r[ecurse]  Also generate included files\n");
    fprintf(stderr, "  -debug      Parse debug trace to stdout\n");
    fprintf(stderr,
            "  --allow-neg-keys  Allow negative field keys (Used to "
            "preserve protocol\n");
    fprintf(stderr, "                compatibility with older .thrift files)\n");
    fprintf(stderr, "  --allow-64bit-consts  Do not print warnings about using 64-bit constants\n");
    fprintf(stderr, "  --gen STR   Generate code with a dynamically-registered generator.\n");
    fprintf(stderr, "                STR has the form language[:key1=val1[,key2[,key3=val3]]].\n");
    fprintf(stderr, "                Keys and values are options passed to the generator.\n");
    fprintf(stderr, "                Many options will not require values.\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "Options related to audit operation\n");
    fprintf(stderr, "   --audit OldFile   Old Thrift file to be audited with 'file'\n");
    fprintf(stderr, "  -Iold dir    Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives for old thrift file\n");
    fprintf(stderr, "  -Inew dir    Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives for new thrift file\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "Available generators (and options):\n");

    t_generator_registry::gen_map_t gen_map = t_generator_registry::get_generator_map();
    t_generator_registry::gen_map_t::iterator iter;
    for (iter = gen_map.begin(); iter != gen_map.end(); ++iter) {
        fprintf(stderr,
                "  %s (%s):\n",
                iter->second->get_short_name().c_str(),
                iter->second->get_long_name().c_str());
        fprintf(stderr, "%s", iter->second->get_documentation().c_str());
    }
    exit(1);
}